

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::ArraysOfArrays::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_19;
  void *local_18;
  ArraysOfArrays *this_local;
  
  local_18 = this;
  this_local = (ArraysOfArrays *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 430                         \nin vec4 position;                    \nuniform vec4 a[3][4][5];             \nvoid main(void)                      \n{                                    \n    gl_Position = position;          \n    for (int i = 0; i < 5; ++i)      \n        gl_Position += a[2][1][i];   \n}"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 430                         \n"
			   "in vec4 position;                    \n"
			   "uniform vec4 a[3][4][5];             \n"
			   "void main(void)                      \n"
			   "{                                    \n"
			   "    gl_Position = position;          \n"
			   "    for (int i = 0; i < 5; ++i)      \n"
			   "        gl_Position += a[2][1][i];   \n"
			   "}";
	}